

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise_x86_fma::create_group_ops
          (DeconvolutionDepthWise_x86_fma *this,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer ppLVar4;
  pointer ppLVar5;
  int *piVar6;
  long *plVar7;
  ulong uVar8;
  Layer *pLVar9;
  void *pvVar10;
  long lVar11;
  int iVar12;
  void *in_R8;
  int i;
  long lVar13;
  uint uVar14;
  uint i_00;
  bool bVar15;
  int local_180;
  Mat local_178;
  void *local_130;
  undefined4 uStack_128;
  undefined4 uStack_124;
  size_t sStack_120;
  int iStack_118;
  Allocator *local_110;
  uint local_108;
  undefined4 uStack_104;
  uint uStack_100;
  uint uStack_fc;
  uint uStack_f8;
  long local_f0;
  int local_e4;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_e0;
  long local_d8;
  Allocator *local_d0;
  size_t local_c8;
  ulong local_c0;
  Mat local_b8;
  long local_70;
  Option *local_68;
  Mat *local_60;
  size_t local_58;
  ModelBinFromMatArray local_50;
  ParamDict pd;
  
  iVar1 = (this->super_DeconvolutionDepthWise).num_output;
  iVar12 = (this->super_DeconvolutionDepthWise).kernel_h *
           (this->super_DeconvolutionDepthWise).kernel_w;
  iVar2 = (this->super_DeconvolutionDepthWise).group;
  uVar8 = (long)(this->super_DeconvolutionDepthWise).weight_data_size / (long)iVar2;
  uVar8 = (long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) / (long)iVar12;
  local_e0 = &this->group_ops;
  lVar13 = 0;
  local_68 = opt;
  while( true ) {
    ppLVar4 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar5 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppLVar5 - (long)ppLVar4) >> 3) <= lVar13) break;
    if (ppLVar4[lVar13] != (Layer *)0x0) {
      (*ppLVar4[lVar13]->_vptr_Layer[1])();
    }
    lVar13 = lVar13 + 1;
  }
  if (ppLVar5 != ppLVar4) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar4;
  }
  iVar3 = (this->super_DeconvolutionDepthWise).group;
  i_00 = (this->super_DeconvolutionDepthWise).num_output / iVar3;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_e0,(long)iVar3);
  local_e4 = (((int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                    (long)(iVar1 / iVar2)) * iVar2) / iVar3) * iVar12 * i_00;
  local_58 = (size_t)local_e4;
  local_70 = (long)(int)i_00;
  local_60 = &(this->super_DeconvolutionDepthWise).activation_params;
  for (lVar13 = 0; lVar13 < (this->super_DeconvolutionDepthWise).group; lVar13 = lVar13 + 1) {
    local_178.elemsize = (this->super_DeconvolutionDepthWise).weight_data.elemsize;
    local_178.data =
         (void *)(lVar13 * local_58 * local_178.elemsize +
                 (long)(this->super_DeconvolutionDepthWise).weight_data.data);
    local_178.elempack = (this->super_DeconvolutionDepthWise).weight_data.elempack;
    local_178.allocator = (this->super_DeconvolutionDepthWise).weight_data.allocator;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.dims = 1;
    local_178.w = (int)local_58;
    local_178.h = 1;
    local_178.d = 1;
    local_178.cstep = local_58;
    local_178.c = local_178.dims;
    Mat::clone(&local_b8,(__fn *)&local_178,(void *)0x0,1,in_R8);
    piVar6 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          free(local_178.data);
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    bVar15 = (this->super_DeconvolutionDepthWise).bias_term == 0;
    if (bVar15) {
      local_c0 = 0;
      local_d0 = (Allocator *)0x0;
      local_180 = 0;
      local_c8 = 0;
      pvVar10 = (void *)0x0;
      local_d8 = 0;
    }
    else {
      local_c8 = (this->super_DeconvolutionDepthWise).bias_data.elemsize;
      pvVar10 = (void *)(lVar13 * local_70 * local_c8 +
                        (long)(this->super_DeconvolutionDepthWise).bias_data.data);
      local_180 = (this->super_DeconvolutionDepthWise).bias_data.elempack;
      local_d0 = (this->super_DeconvolutionDepthWise).bias_data.allocator;
      local_c0 = (ulong)i_00;
      local_d8 = local_70;
    }
    uVar14 = (uint)!bVar15;
    pLVar9 = create_layer_cpu(8);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,i_00);
    ParamDict::set(&pd,1,(this->super_DeconvolutionDepthWise).kernel_w);
    ParamDict::set(&pd,0xb,(this->super_DeconvolutionDepthWise).kernel_h);
    ParamDict::set(&pd,2,(this->super_DeconvolutionDepthWise).dilation_w);
    ParamDict::set(&pd,0xc,(this->super_DeconvolutionDepthWise).dilation_h);
    ParamDict::set(&pd,3,(this->super_DeconvolutionDepthWise).stride_w);
    ParamDict::set(&pd,0xd,(this->super_DeconvolutionDepthWise).stride_h);
    ParamDict::set(&pd,4,0);
    ParamDict::set(&pd,0xe,0);
    ParamDict::set(&pd,0x12,(this->super_DeconvolutionDepthWise).output_pad_right);
    ParamDict::set(&pd,0x13,(this->super_DeconvolutionDepthWise).output_pad_bottom);
    ParamDict::set(&pd,5,(this->super_DeconvolutionDepthWise).bias_term);
    ParamDict::set(&pd,6,local_e4);
    ParamDict::set(&pd,9,(this->super_DeconvolutionDepthWise).activation_type);
    ParamDict::set(&pd,10,local_60);
    (*pLVar9->_vptr_Layer[2])(pLVar9,&pd);
    local_178.refcount._0_4_ = SUB84(local_b8.refcount,0);
    local_178.refcount._4_4_ = (undefined4)((ulong)local_b8.refcount >> 0x20);
    local_178.dims = local_b8.dims;
    local_178.w = local_b8.w;
    if ((this->super_DeconvolutionDepthWise).bias_term == 0) {
      if (local_b8.refcount != (int *)0x0) {
        LOCK();
        *local_b8.refcount = *local_b8.refcount + 1;
        UNLOCK();
      }
      local_178.data = local_b8.data;
      local_178.elemsize = local_b8.elemsize;
      local_178.elempack = local_b8.elempack;
      local_178.allocator = local_b8.allocator;
      local_178.h = local_b8.h;
      local_178.d = local_b8.d;
      local_178.c = local_b8.c;
      local_178.cstep = local_b8.cstep;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_50,&local_178);
      (*pLVar9->_vptr_Layer[3])(pLVar9,&local_50);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_50);
      piVar6 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_178.allocator == (Allocator *)0x0) {
            free(local_178.data);
          }
          else {
            (*(local_178.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      if (local_b8.refcount != (int *)0x0) {
        LOCK();
        *local_b8.refcount = *local_b8.refcount + 1;
        UNLOCK();
      }
      local_178.cstep = local_b8.cstep;
      local_178.c = local_b8.c;
      local_178.h = local_b8.h;
      local_178.d = local_b8.d;
      local_178.allocator = local_b8.allocator;
      local_178.elempack = local_b8.elempack;
      local_178.elemsize = local_b8.elemsize;
      local_178.data = local_b8.data;
      uStack_128 = 0;
      uStack_124 = 0;
      sStack_120 = local_c8;
      iStack_118 = local_180;
      local_110 = local_d0;
      uStack_104 = (undefined4)local_c0;
      local_f0 = local_d8;
      local_130 = pvVar10;
      local_108 = uVar14;
      uStack_100 = uVar14;
      uStack_fc = uVar14;
      uStack_f8 = uVar14;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_50,&local_178);
      (*pLVar9->_vptr_Layer[3])(pLVar9,&local_50);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_50);
      lVar11 = 0x48;
      do {
        piVar6 = *(int **)((long)&local_178.refcount + lVar11);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            plVar7 = *(long **)((long)&local_178.allocator + lVar11);
            if (plVar7 == (long *)0x0) {
              free(*(void **)((long)&local_178.data + lVar11));
            }
            else {
              (**(code **)(*plVar7 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_178.cstep + lVar11) = 0;
        *(undefined8 *)((long)&local_178.refcount + lVar11 + 4) = 0;
        *(undefined8 *)((long)&local_178.elemsize + lVar11 + 4) = 0;
        *(undefined8 *)((long)&local_178.data + lVar11) = 0;
        *(undefined8 *)((long)&local_178.refcount + lVar11) = 0;
        *(undefined4 *)((long)&local_178.c + lVar11) = 0;
        *(undefined8 *)((long)&local_178.dims + lVar11) = 0;
        *(undefined8 *)((long)&local_178.h + lVar11) = 0;
        lVar11 = lVar11 + -0x48;
      } while (lVar11 != -0x48);
    }
    (*pLVar9->_vptr_Layer[4])(pLVar9,local_68);
    (local_e0->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
    super__Vector_impl_data._M_start[lVar13] = pLVar9;
    ParamDict::~ParamDict(&pd);
    if (local_b8.refcount != (int *)0x0) {
      LOCK();
      *local_b8.refcount = *local_b8.refcount + -1;
      UNLOCK();
      if (*local_b8.refcount == 0) {
        if (local_b8.allocator == (Allocator *)0x0) {
          free(local_b8.data);
        }
        else {
          (*(local_b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise_x86_fma::create_group_ops(const Option& opt)
{
    // create Deconvolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::Deconvolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(18, output_pad_right);
        pd.set(19, output_pad_bottom);
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data_g;

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}